

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O3

void addnum2buff(BuffFS *buff,TValue *num)

{
  int iVar1;
  
  iVar1 = buff->blen;
  if (0x9b < (long)iVar1) {
    pushstr(buff,buff->space,(long)iVar1);
    buff->blen = 0;
    iVar1 = 0;
  }
  iVar1 = tostringbuff(num,buff->space + iVar1);
  buff->blen = buff->blen + iVar1;
  return;
}

Assistant:

static void addnum2buff (BuffFS *buff, TValue *num) {
  char *numbuff = getbuff(buff, MAXNUMBER2STR);
  int len = tostringbuff(num, numbuff);  /* format number into 'numbuff' */
  addsize(buff, len);
}